

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureWeight *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  uint index;
  size_t sVar5;
  
  uVar3 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = (size_t)uVar3;
  if (sVar5 == 0) {
    sVar5 = 0;
  }
  else {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
                          (&(this->weights_).super_RepeatedPtrFieldBase,index);
      sVar4 = BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong(this_00);
      uVar2 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar3 != index);
  }
  if (this->featureid_ != 0) {
    uVar3 = this->featureid_ | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t BayesianProbitRegressor_FeatureWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  size_t total_size = 0;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // uint32 featureId = 1;
  if (this->featureid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->featureid());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}